

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Input.cxx
# Opt level: O1

void __thiscall Fl_File_Input::draw_buttons(Fl_File_Input *this)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  short sVar4;
  int Y;
  int X;
  Fl_Boxtype t;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar5;
  
  if (((this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.damage_ & 0x90) != 0) {
    update_buttons(this);
  }
  sVar4 = this->buttons_[0];
  uVar9 = 0;
  if (sVar4 == 0) {
    iVar8 = 0;
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    iVar8 = 0;
    do {
      iVar5 = (int)sVar4;
      iVar1 = (this->super_Fl_Input).super_Fl_Input_.xscroll_;
      iVar7 = (iVar8 + iVar5) - iVar1;
      if (iVar7 != 0 && iVar1 <= iVar8 + iVar5) {
        if (iVar8 < iVar1) {
          if (uVar9 == (uint)(int)this->pressed_) {
            bVar3 = 1 < this->down_box_ | this->down_box_;
          }
          else {
            bVar3 = this->down_box_;
          }
          t = (Fl_Boxtype)bVar3;
          X = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_;
          Y = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_;
          iVar5 = iVar7;
        }
        else {
          iVar2 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.w_;
          if (iVar2 < iVar7) {
            if (uVar9 == (uint)(int)this->pressed_) {
              bVar3 = 1 < this->down_box_ | this->down_box_;
            }
            else {
              bVar3 = this->down_box_;
            }
            X = (iVar8 - iVar1) + (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_;
            t = (Fl_Boxtype)bVar3;
            Y = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_;
            iVar5 = iVar1 + iVar6 + iVar2;
          }
          else {
            if (uVar9 == (uint)(int)this->pressed_) {
              bVar3 = 1 < this->down_box_ | this->down_box_;
            }
            else {
              bVar3 = this->down_box_;
            }
            t = (Fl_Boxtype)bVar3;
            X = (iVar8 - iVar1) + (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_;
            Y = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_;
          }
        }
        Fl_Widget::draw_box((Fl_Widget *)this,t,X,Y,iVar5,10,0x31);
      }
      iVar8 = iVar8 + this->buttons_[uVar9];
      iVar6 = -iVar8;
      sVar4 = this->buttons_[uVar9 + 1];
      uVar9 = uVar9 + 1;
    } while (sVar4 != 0);
  }
  iVar1 = (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.w_;
  if (iVar8 < iVar1) {
    iVar5 = (this->super_Fl_Input).super_Fl_Input_.xscroll_;
    Fl_Widget::draw_box((Fl_Widget *)this,
                        (uint)((1 < this->down_box_ && (int)uVar9 == (int)this->pressed_) |
                              this->down_box_),
                        (iVar8 + (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.x_) - iVar5,
                        (this->super_Fl_Input).super_Fl_Input_.super_Fl_Widget.y_,
                        iVar1 + iVar6 + iVar5,10,0x31);
  }
  return;
}

Assistant:

void Fl_File_Input::draw_buttons() {
  int	i,					// Looping var
	X;					// Current X position


  if (damage() & (FL_DAMAGE_BAR | FL_DAMAGE_ALL)) {
    update_buttons();
  }

  for (X = 0, i = 0; buttons_[i]; i ++)
  {
    if ((X + buttons_[i]) > xscroll()) {
      if (X < xscroll()) {
        draw_box(pressed_ == i ? fl_down(down_box()) : down_box(),
                 x(), y(), X + buttons_[i] - xscroll(), DIR_HEIGHT, FL_GRAY);
      } else if ((X + buttons_[i] - xscroll()) > w()) {
	draw_box(pressed_ == i ? fl_down(down_box()) : down_box(),
        	 x() + X - xscroll(), y(), w() - X + xscroll(), DIR_HEIGHT,
		 FL_GRAY);
      } else {
        draw_box(pressed_ == i ? fl_down(down_box()) : down_box(),
	         x() + X - xscroll(), y(), buttons_[i], DIR_HEIGHT, FL_GRAY);
      }
    }

    X += buttons_[i];
  }

  if (X < w()) {
    draw_box(pressed_ == i ? fl_down(down_box()) : down_box(),
             x() + X - xscroll(), y(), w() - X + xscroll(), DIR_HEIGHT, FL_GRAY);
  }
}